

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O2

void WebRtcSpl_Resample16khzTo22khz
               (int16_t *in,int16_t *out,WebRtcSpl_State16khzTo22khz *state,int32_t *tmpmem)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  int16_t *piVar4;
  long lVar5;
  int32_t *in1;
  
  for (iVar3 = 0; iVar3 != 4; iVar3 = iVar3 + 1) {
    WebRtcSpl_UpBy2ShortToInt(in,0x28,tmpmem + 8,state->S_16_32);
    *tmpmem = state->S_32_22[0];
    tmpmem[1] = state->S_32_22[1];
    tmpmem[2] = state->S_32_22[2];
    tmpmem[3] = state->S_32_22[3];
    tmpmem[4] = state->S_32_22[4];
    tmpmem[5] = state->S_32_22[5];
    tmpmem[6] = state->S_32_22[6];
    tmpmem[7] = state->S_32_22[7];
    state->S_32_22[0] = tmpmem[0x50];
    state->S_32_22[1] = tmpmem[0x51];
    state->S_32_22[2] = tmpmem[0x52];
    state->S_32_22[3] = tmpmem[0x53];
    state->S_32_22[4] = tmpmem[0x54];
    state->S_32_22[5] = tmpmem[0x55];
    state->S_32_22[6] = tmpmem[0x56];
    state->S_32_22[7] = tmpmem[0x57];
    piVar4 = out;
    for (lVar5 = 0; (int)lVar5 != 0x140; lVar5 = lVar5 + 0x40) {
      in1 = (int32_t *)((long)tmpmem + lVar5 + 0xc);
      iVar2 = *in1;
      if (0x7ffe < iVar2) {
        iVar2 = 0x7fff;
      }
      iVar1 = (int16_t)iVar2;
      if (iVar2 < -0x7fff) {
        iVar1 = -0x8000;
      }
      *piVar4 = iVar1;
      WebRtcSpl_DotProdIntToShort
                ((int32_t *)((long)tmpmem + lVar5),(int32_t *)((long)tmpmem + lVar5 + 0x58),
                 kCoefficients32To22[0],piVar4 + 1,piVar4 + 10);
      WebRtcSpl_DotProdIntToShort
                ((int32_t *)((long)tmpmem + lVar5 + 8),(int32_t *)((long)tmpmem + lVar5 + 0x50),
                 kCoefficients32To22[1],piVar4 + 2,piVar4 + 9);
      WebRtcSpl_DotProdIntToShort
                (in1,(int32_t *)((long)tmpmem + lVar5 + 0x4c),kCoefficients32To22[2],piVar4 + 3,
                 piVar4 + 8);
      WebRtcSpl_DotProdIntToShort
                ((int32_t *)((long)tmpmem + lVar5 + 0x14),(int32_t *)((long)tmpmem + lVar5 + 0x44),
                 kCoefficients32To22[3],piVar4 + 4,piVar4 + 7);
      WebRtcSpl_DotProdIntToShort
                ((int32_t *)((long)tmpmem + lVar5 + 0x18),(int32_t *)((long)tmpmem + lVar5 + 0x40),
                 kCoefficients32To22[4],piVar4 + 5,piVar4 + 6);
      piVar4 = piVar4 + 0xb;
    }
    in = in + 0x28;
    out = out + 0x37;
  }
  return;
}

Assistant:

void WebRtcSpl_Resample16khzTo22khz(const int16_t* in, int16_t* out,
                                    WebRtcSpl_State16khzTo22khz* state, int32_t* tmpmem)
{
    int k;

    // process two blocks of 10/SUB_BLOCKS_16_22 ms (to reduce temp buffer size)
    for (k = 0; k < SUB_BLOCKS_16_22; k++)
    {
        ///// 16 --> 32 /////
        // int16_t  in[160/SUB_BLOCKS_16_22]
        // int32_t out[320/SUB_BLOCKS_16_22]
        /////
        WebRtcSpl_UpBy2ShortToInt(in, 160 / SUB_BLOCKS_16_22, tmpmem + 8, state->S_16_32);

        ///// 32 --> 22 /////
        // int32_t  in[320/SUB_BLOCKS_16_22]
        // int32_t out[220/SUB_BLOCKS_16_22]
        /////
        // copy state to and from input array
        tmpmem[0] = state->S_32_22[0];
        tmpmem[1] = state->S_32_22[1];
        tmpmem[2] = state->S_32_22[2];
        tmpmem[3] = state->S_32_22[3];
        tmpmem[4] = state->S_32_22[4];
        tmpmem[5] = state->S_32_22[5];
        tmpmem[6] = state->S_32_22[6];
        tmpmem[7] = state->S_32_22[7];
        state->S_32_22[0] = tmpmem[320 / SUB_BLOCKS_16_22];
        state->S_32_22[1] = tmpmem[320 / SUB_BLOCKS_16_22 + 1];
        state->S_32_22[2] = tmpmem[320 / SUB_BLOCKS_16_22 + 2];
        state->S_32_22[3] = tmpmem[320 / SUB_BLOCKS_16_22 + 3];
        state->S_32_22[4] = tmpmem[320 / SUB_BLOCKS_16_22 + 4];
        state->S_32_22[5] = tmpmem[320 / SUB_BLOCKS_16_22 + 5];
        state->S_32_22[6] = tmpmem[320 / SUB_BLOCKS_16_22 + 6];
        state->S_32_22[7] = tmpmem[320 / SUB_BLOCKS_16_22 + 7];

        WebRtcSpl_32khzTo22khzIntToShort(tmpmem, out, 20 / SUB_BLOCKS_16_22);

        // move input/output pointers 10/SUB_BLOCKS_16_22 ms seconds ahead
        in += 160 / SUB_BLOCKS_16_22;
        out += 220 / SUB_BLOCKS_16_22;
    }
}